

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pcache1InitBulk(PCache1 *pCache)

{
  int iVar1;
  PgHdr1 *pPVar2;
  PgHdr1 *pX;
  void *pvStack_28;
  int nBulk;
  char *zBulk;
  i64 szBulk;
  PCache1 *pCache_local;
  
  if (pcache1_g.nInitPage == 0) {
    pCache_local._4_4_ = 0;
  }
  else if (pCache->nMax < 3) {
    pCache_local._4_4_ = 0;
  }
  else {
    sqlite3BeginBenignMalloc();
    if (pcache1_g.nInitPage < 1) {
      zBulk = (char *)((long)pcache1_g.nInitPage * -0x400);
    }
    else {
      zBulk = (char *)((long)pCache->szAlloc * (long)pcache1_g.nInitPage);
    }
    if ((long)((long)pCache->szAlloc * (ulong)pCache->nMax) < (long)zBulk) {
      zBulk = (char *)((long)pCache->szAlloc * (ulong)pCache->nMax);
    }
    pvStack_28 = sqlite3Malloc((u64)zBulk);
    pCache->pBulk = pvStack_28;
    sqlite3EndBenignMalloc();
    if (pvStack_28 != (void *)0x0) {
      iVar1 = sqlite3MallocSize(pvStack_28);
      pX._4_4_ = iVar1 / pCache->szAlloc;
      do {
        pPVar2 = (PgHdr1 *)((long)pvStack_28 + (long)pCache->szPage);
        (pPVar2->page).pBuf = pvStack_28;
        (pPVar2->page).pExtra = pPVar2 + 1;
        pPVar2->isBulkLocal = '\x01';
        pPVar2->isAnchor = '\0';
        pPVar2->pNext = pCache->pFree;
        pCache->pFree = pPVar2;
        pvStack_28 = (void *)((long)pvStack_28 + (long)pCache->szAlloc);
        pX._4_4_ = pX._4_4_ + -1;
      } while (pX._4_4_ != 0);
    }
    pCache_local._4_4_ = (uint)(pCache->pFree != (PgHdr1 *)0x0);
  }
  return pCache_local._4_4_;
}

Assistant:

static int pcache1InitBulk(PCache1 *pCache){
  i64 szBulk;
  char *zBulk;
  if( pcache1.nInitPage==0 ) return 0;
  /* Do not bother with a bulk allocation if the cache size very small */
  if( pCache->nMax<3 ) return 0;
  sqlite3BeginBenignMalloc();
  if( pcache1.nInitPage>0 ){
    szBulk = pCache->szAlloc * (i64)pcache1.nInitPage;
  }else{
    szBulk = -1024 * (i64)pcache1.nInitPage;
  }
  if( szBulk > pCache->szAlloc*(i64)pCache->nMax ){
    szBulk = pCache->szAlloc*(i64)pCache->nMax;
  }
  zBulk = pCache->pBulk = sqlite3Malloc( szBulk );
  sqlite3EndBenignMalloc();
  if( zBulk ){
    int nBulk = sqlite3MallocSize(zBulk)/pCache->szAlloc;
    do{
      PgHdr1 *pX = (PgHdr1*)&zBulk[pCache->szPage];
      pX->page.pBuf = zBulk;
      pX->page.pExtra = &pX[1];
      pX->isBulkLocal = 1;
      pX->isAnchor = 0;
      pX->pNext = pCache->pFree;
      pCache->pFree = pX;
      zBulk += pCache->szAlloc;
    }while( --nBulk );
  }
  return pCache->pFree!=0;
}